

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O3

Span * __thiscall tcmalloc::PageHeap::Split(PageHeap *this,Span *span,Length n)

{
  Span *pSVar1;
  ulong uVar2;
  
  pSVar1 = NewSpan(span->start + n,(long)((int)span->length - (int)n));
  uVar2 = pSVar1->start;
  (this->pagemap_).root_[uVar2 >> 0x12]->values[(uint)uVar2 & 0x3ffff] = pSVar1;
  if (1 < pSVar1->length) {
    uVar2 = (uVar2 + pSVar1->length) - 1;
    (this->pagemap_).root_[uVar2 >> 0x12]->values[(uint)uVar2 & 0x3ffff] = pSVar1;
  }
  uVar2 = (span->start + n) - 1;
  (this->pagemap_).root_[uVar2 >> 0x12]->values[(uint)uVar2 & 0x3ffff] = span;
  span->length = n;
  return pSVar1;
}

Assistant:

Span* PageHeap::Split(Span* span, Length n) {
  ASSERT(lock_.IsHeld());
  ASSERT(0 < n);
  ASSERT(n < span->length);
  ASSERT(span->location == Span::IN_USE);
  ASSERT(span->sizeclass == 0);

  const int extra = span->length - n;
  Span* leftover = NewSpan(span->start + n, extra);
  ASSERT(leftover->location == Span::IN_USE);
  RecordSpan(leftover);
  pagemap_.set(span->start + n - 1, span); // Update map from pageid to span
  span->length = n;

  return leftover;
}